

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void __thiscall
wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::walk
          (Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *this,Expression **root)

{
  TaskFunc p_Var1;
  Expression **ppEVar2;
  Task *pTVar3;
  
  if (((long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task,_std::allocator<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task,_std::allocator<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) + (this->stack).usedFixed != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<Sinker, wasm::Visitor<Sinker>>::walk(Expression *&) [SubType = Sinker, VisitorType = wasm::Visitor<Sinker>]"
                 );
  }
  pushTask(this,PostWalker<Sinker,_wasm::Visitor<Sinker,_void>_>::scan,root);
  if (((long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task,_std::allocator<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task,_std::allocator<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) + (this->stack).usedFixed != 0) {
    do {
      pTVar3 = SmallVector<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task,_10UL>::back
                         (&this->stack);
      p_Var1 = pTVar3->func;
      ppEVar2 = pTVar3->currp;
      SmallVector<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task,_10UL>::pop_back
                (&this->stack);
      this->replacep = ppEVar2;
      if (*ppEVar2 == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<Sinker, wasm::Visitor<Sinker>>::walk(Expression *&) [SubType = Sinker, VisitorType = wasm::Visitor<Sinker>]"
                     );
      }
      (*p_Var1)((Sinker *)this,ppEVar2);
    } while (((long)(this->stack).flexible.
                    super__Vector_base<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task,_std::allocator<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->stack).flexible.
                    super__Vector_base<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task,_std::allocator<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) + (this->stack).usedFixed != 0);
  }
  return;
}

Assistant:

void walk(Expression*& root) {
    assert(stack.size() == 0);
    pushTask(SubType::scan, &root);
    while (stack.size() > 0) {
      auto task = popTask();
      replacep = task.currp;
      assert(*task.currp);
      task.func(static_cast<SubType*>(this), task.currp);
    }
  }